

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O3

IBot<ttt::Board> * __thiscall
generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::Clone
          (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *this)

{
  int iVar1;
  Board *pBVar2;
  IBot<ttt::Board> *pIVar3;
  Board *pBVar4;
  
  pIVar3 = (IBot<ttt::Board> *)operator_new(0x18);
  pBVar2 = (this->super_IBot<ttt::Board>).game;
  iVar1 = this->depth;
  pIVar3->_vptr_IBot = (_func_int **)&PTR__IBot_00161588;
  if (pBVar2 != (Board *)0x0) {
    pBVar4 = (Board *)operator_new(10);
    *(undefined2 *)((pBVar4->board)._M_elems[2]._M_elems + 2) =
         *(undefined2 *)((pBVar2->board)._M_elems[2]._M_elems + 2);
    *(undefined8 *)(pBVar4->board)._M_elems = *(undefined8 *)(pBVar2->board)._M_elems;
    pIVar3->game = pBVar4;
  }
  pIVar3->_vptr_IBot = (_func_int **)&PTR__IBot_001615c0;
  *(int *)&pIVar3[1]._vptr_IBot = iVar1;
  return pIVar3;
}

Assistant:

game::IBot<IGame> *Clone() const
    {
        return new MinimaxBot(this->game, depth);
    }